

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

err_t MATROSKA_BlockGetFrame
                (matroska_block *Block,size_t FrameNum,matroska_frame *Frame,bool_t WithData)

{
  long lVar1;
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  mkv_timestamp_t mVar6;
  
  if (WithData == 0) {
    if ((Block->SizeList)._Used >> 2 <= FrameNum) {
      return -4;
    }
    puVar2 = (uint8_t *)0x0;
  }
  else {
    if ((Block->Base).Base.bValueIsSet == '\0') {
      __assert_fail("!WithData || Block->Base.Base.bValueIsSet",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x5ff,
                    "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                   );
    }
    if ((Block->Data)._Used == 0) {
      return -0x15;
    }
    if ((Block->SizeList)._Used >> 2 <= FrameNum) {
      return -4;
    }
    puVar2 = (uint8_t *)(Block->Data)._Begin;
  }
  mVar6 = 0x7fffffffffffffff;
  Frame->Data = puVar2;
  lVar3 = MATROSKA_BlockTimestamp(Block);
  Frame->Timestamp = lVar3;
  for (uVar4 = 0; FrameNum != uVar4; uVar4 = uVar4 + 1) {
    if (WithData != 0) {
      Frame->Data = Frame->Data + *(uint *)((Block->SizeList)._Begin + uVar4 * 4);
    }
    lVar5 = 0x7fffffffffffffff;
    if (lVar3 != 0x7fffffffffffffff) {
      lVar5 = 0x7fffffffffffffff;
      if ((uVar4 < (Block->Durations)._Used >> 3) &&
         (lVar1 = *(long *)((Block->Durations)._Begin + uVar4 * 8), lVar5 = lVar3 + lVar1,
         lVar1 == 0x7fffffffffffffff)) {
        lVar5 = 0x7fffffffffffffff;
      }
      Frame->Timestamp = lVar5;
    }
    lVar3 = lVar5;
  }
  Frame->Size = *(uint32_t *)((Block->SizeList)._Begin + FrameNum * 4);
  if (FrameNum < (Block->Durations)._Used >> 3) {
    mVar6 = *(mkv_timestamp_t *)((Block->Durations)._Begin + FrameNum * 8);
  }
  Frame->Duration = mVar6;
  return 0;
}

Assistant:

err_t MATROSKA_BlockGetFrame(const matroska_block *Block, size_t FrameNum, matroska_frame *Frame, bool_t WithData)
{
    size_t i;

    assert(!WithData || Block->Base.Base.bValueIsSet);
    if (WithData && !ARRAYCOUNT(Block->Data,uint8_t))
        return ERR_READ;
    if (FrameNum >= ARRAYCOUNT(Block->SizeList,uint32_t))
        return ERR_INVALID_PARAM;

    Frame->Data = WithData ? ARRAYBEGIN(Block->Data,uint8_t) : NULL;
    Frame->Timestamp = MATROSKA_BlockTimestamp((matroska_block*)Block);
    for (i=0;i<FrameNum;++i)
    {
        if (WithData) Frame->Data += ARRAYBEGIN(Block->SizeList,uint32_t)[i];
        if (Frame->Timestamp != INVALID_TIMESTAMP_T)
        {
            if (i < ARRAYCOUNT(Block->Durations,mkv_timestamp_t) && ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i] != INVALID_TIMESTAMP_T)
                Frame->Timestamp += ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
            else
                Frame->Timestamp = INVALID_TIMESTAMP_T;
        }
    }

    Frame->Size = ARRAYBEGIN(Block->SizeList,uint32_t)[i];
    if (FrameNum < ARRAYCOUNT(Block->Durations,mkv_timestamp_t))
        Frame->Duration = ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
    else
        Frame->Duration = INVALID_TIMESTAMP_T;
    return ERR_NONE;
}